

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O3

void __thiscall
hbm::streaming::SubscribedSignal::SubscribedSignal(SubscribedSignal *this,uint signalNumber)

{
  this->m_signalNumber = signalNumber;
  (this->m_signalReference)._M_dataplus._M_p = (pointer)&(this->m_signalReference).field_2;
  (this->m_signalReference)._M_string_length = 0;
  (this->m_signalReference).field_2._M_local_buf[0] = '\0';
  deltaTimeInfo::deltaTimeInfo(&this->m_syncSignalTime);
  this->m_dataFormatPattern = PATTERN_V;
  this->m_dataIsBigEndian = false;
  this->m_dataValueType = DATATYPE_REAL32;
  this->m_dataValueSize = 4;
  this->m_dataTimeType = TIMETYPE_NTP;
  this->m_dataTimeSize = 0;
  return;
}

Assistant:

SubscribedSignal::SubscribedSignal(unsigned int signalNumber)
			: m_signalNumber(signalNumber)
			, m_signalReference()
			, m_syncSignalTime()

			, m_dataFormatPattern()
			, m_dataIsBigEndian(false)
			, m_dataValueType(DATATYPE_REAL32)
			, m_dataValueSize(4) // may not be zero because it is used as divisor.
			, m_dataTimeType()
			, m_dataTimeSize(0)
		{
		}